

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

BasicHeapType __thiscall wasm::HeapType::getUnsharedBottom(HeapType *this)

{
  ulong uVar1;
  uint uVar2;
  undefined *puVar3;
  
  uVar1 = this->id;
  if (uVar1 < 0x7d) {
    uVar2 = (uint)uVar1 & 0x7b;
    uVar2 = uVar2 << 0x1d | uVar2 - 8 >> 3;
    if (uVar2 < 0xf) {
      puVar3 = &DAT_00e5564c;
      goto LAB_00cc1319;
    }
    if (uVar1 < 0x7d) {
      __assert_fail("!ht.isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                    ,0xe6,"HeapTypeInfo *wasm::(anonymous namespace)::getHeapTypeInfo(HeapType)");
    }
  }
  uVar2 = *(int *)(uVar1 + 0x30) - 1;
  if (3 < uVar2) {
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x457);
  }
  puVar3 = &DAT_00e556b0;
LAB_00cc1319:
  return *(BasicHeapType *)(puVar3 + (ulong)uVar2 * 4);
}

Assistant:

HeapType::BasicHeapType HeapType::getUnsharedBottom() const {
  if (isBasic()) {
    switch (getBasic(Unshared)) {
      case ext:
        return noext;
      case func:
        return nofunc;
      case cont:
        return nocont;
      case exn:
        return noexn;
      case any:
      case eq:
      case i31:
      case struct_:
      case array:
      case none:
        return none;
      case string:
      case noext:
        return noext;
      case nofunc:
        return nofunc;
      case nocont:
        return nocont;
      case noexn:
        return noexn;
    }
  }
  auto* info = getHeapTypeInfo(*this);
  switch (info->kind) {
    case HeapTypeKind::Func:
      return nofunc;
    case HeapTypeKind::Cont:
      return nocont;
    case HeapTypeKind::Struct:
    case HeapTypeKind::Array:
      return none;
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}